

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O2

Proxy ApplicativeHelper::getProxy(TermList t)

{
  if ((t._content & 1) == 0) {
    return *(Proxy *)(*(long *)(*(long *)(DAT_00a14190 + 0x60) +
                               (ulong)*(uint *)(t._content + 8) * 8) + 0x44);
  }
  return NOT_PROXY;
}

Assistant:

Signature::Proxy ApplicativeHelper::getProxy(const TermList t)
{
  if(t.isVar()){
    return Signature::NOT_PROXY;
  }
  return env.signature->getFunction(t.term()->functor())->proxy();
}